

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O0

char * getInmateName(char ch)

{
  char *pcStack_10;
  char ch_local;
  
  switch(ch) {
  case 'a':
    pcStack_10 = "[a]ttorney(30)";
    break;
  case 'b':
    pcStack_10 = "[b]ruiser(16)";
    break;
  case 'c':
    pcStack_10 = "[c]utie(20)";
    break;
  case 'd':
    pcStack_10 = "[d]octor(10)";
    break;
  default:
    pcStack_10 = "FAIL";
    break;
  case 'f':
    pcStack_10 = "[f]fatty(60)";
    break;
  case 'h':
    pcStack_10 = "[h]omeboy(10)";
    break;
  case 'l':
    pcStack_10 = "[l]unatic(16)";
    break;
  case 's':
    pcStack_10 = "[s]peedy(10)";
  }
  return pcStack_10;
}

Assistant:

char *getInmateName(char ch) {
    switch (ch) {
        case 'h':
            return "[h]omeboy(10)";
        case 'b':
            return "[b]ruiser(16)";
        case 'l':
            return "[l]unatic(16)";
        case 'f':
            return "[f]fatty(60)";
        case 's':
            return "[s]peedy(10)";
        case 'c':
            return "[c]utie(20)";
        case 'a':
            return "[a]ttorney(30)";
        case 'd':
            return "[d]octor(10)";
        default:
            return "FAIL";
    }
}